

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall create::Create::setAllMotors(Create *this,float *main,float *side,float *vacuum)

{
  float fVar1;
  undefined1 uVar2;
  ProtocolVersion PVar3;
  ssize_t sVar4;
  byte bVar5;
  undefined7 uVar6;
  int __fd;
  element_type *this_00;
  int in_R8D;
  float fVar7;
  float fVar8;
  void *pvStack_60;
  uint8_t cmd_1 [2];
  uint8_t cmd [4];
  
  bVar5 = (byte)vacuum;
  uVar6 = (undefined7)((ulong)vacuum >> 8);
  if (((1.0 < ABS(*main)) || (fVar8 = *side, 1.0 < ABS(fVar8))) ||
     (fVar1 = *vacuum, 1.0 < ABS(fVar1))) {
    uVar2 = 0;
  }
  else {
    fVar7 = roundf(*main * 127.0);
    this->mainMotorPower = (uint8_t)(int)fVar7;
    fVar8 = roundf(fVar8 * 127.0);
    this->sideMotorPower = (uint8_t)(int)fVar8;
    fVar8 = roundf(fVar1 * 127.0);
    this->vacuumMotorPower = (uint8_t)(int)fVar8;
    PVar3 = RobotModel::getVersion(&this->model);
    if (PVar3 == V_1) {
      __fd = (int)cmd_1;
      cmd_1[0] = 0x8a;
      bVar5 = (*main != 0.0) << 2 | (*vacuum != 0.0) * '\x02' | *side != 0.0;
      this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pvStack_60 = (void *)0x2;
      cmd_1[1] = bVar5;
    }
    else {
      __fd = (int)cmd;
      cmd[0] = 0x90;
      cmd[1] = this->mainMotorPower;
      cmd[2] = this->sideMotorPower;
      cmd[3] = this->vacuumMotorPower;
      this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pvStack_60 = (void *)0x4;
    }
    sVar4 = Serial::send(this_00,__fd,pvStack_60,CONCAT71(uVar6,bVar5),in_R8D);
    uVar2 = (undefined1)sVar4;
  }
  return (bool)uVar2;
}

Assistant:

bool Create::setAllMotors(const float& main, const float& side, const float& vacuum) {
    if (main < -1.0 || main > 1.0 ||
        side < -1.0 || side > 1.0 ||
        vacuum < -1.0 || vacuum > 1.0)
      return false;

    mainMotorPower = roundf(main * 127);
    sideMotorPower = roundf(side * 127);
    vacuumMotorPower = roundf(vacuum * 127);

    if (model.getVersion() == V_1) {
        uint8_t cmd[2] = { OC_MOTORS,
                           static_cast<uint8_t>((side != 0.0 ? 1 : 0) |
                                     (vacuum != 0.0 ? 2 : 0) |
                                     (main != 0.0 ? 4 : 0))
                         };
        return serial->send(cmd, 2);
    }

    uint8_t cmd[4] = { OC_MOTORS_PWM,
                       mainMotorPower,
                       sideMotorPower,
                       vacuumMotorPower
                     };

    return serial->send(cmd, 4);
  }